

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O3

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::
SparseMatrix<(iDynTree::MatrixStorageOrdering)0>
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *other)

{
  size_t sVar1;
  Triplets oldTriplets;
  Triplets local_38;
  
  VectorDynSize::VectorDynSize(&this->m_values);
  this->m_allocatedSize = 0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = other->m_columns;
  this->m_rows = other->m_rows;
  this->m_columns = sVar1;
  local_38.m_triplets.super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_triplets.super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_triplets.super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = VectorDynSize::size(&other->m_values);
  Triplets::reserve(&local_38,sVar1);
  Triplets::addSubMatrix<(iDynTree::MatrixStorageOrdering)0>(&local_38,0,0,other);
  setFromTriplets(this,&local_38);
  if (local_38.m_triplets.super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.m_triplets.
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

SparseMatrix<iDynTree::ColumnMajor>::SparseMatrix(const SparseMatrix<iDynTree::RowMajor>& other)
    : m_allocatedSize(0)
    , m_rows(other.rows())
    , m_columns(other.columns())
    {
        iDynTree::Triplets oldTriplets;
        oldTriplets.reserve(other.numberOfNonZeros());
        oldTriplets.addSubMatrix(0, 0, other);

        setFromTriplets(oldTriplets);
    }